

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_171beb8::SatdLpTest::SatdLpTest(SatdLpTest *this)

{
  _func_int_short_ptr_int *p_Var1;
  int *piVar2;
  bool bVar3;
  ostream *poVar4;
  GTestLog local_14;
  
  bVar3 = testing::internal::IsTrue
                    (testing::
                     WithParamInterface<(anonymous_namespace)::SatdTestParam<int(*)(short_const*,int)>>
                     ::parameter_ != (int *)0x0);
  if (!bVar3) {
    testing::internal::GTestLog::GTestLog
              (&local_14,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/gtest.h"
               ,0x67d);
    poVar4 = std::operator<<((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ");
    poVar4 = std::operator<<(poVar4,
                             "GetParam() can only be called inside a value-parameterized test ");
    std::operator<<(poVar4,"-- did you intend to write TEST_P instead of TEST_F?");
    testing::internal::GTestLog::~GTestLog(&local_14);
  }
  piVar2 = testing::
           WithParamInterface<(anonymous_namespace)::SatdTestParam<int(*)(short_const*,int)>>::
           parameter_;
  testing::Test::Test((Test *)this);
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).rnd_.random_.state_ = 0xbaba;
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).satd_size_ = *piVar2;
  p_Var1 = *(_func_int_short_ptr_int **)(piVar2 + 4);
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).satd_func_ref_ =
       *(_func_int_short_ptr_int **)(piVar2 + 2);
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).satd_func_simd_ = p_Var1;
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).super_Test._vptr_Test =
       (_func_int **)&PTR__SatdTestBase_00f45f60;
  (this->super_SatdTestBase<short,_int_(*)(const_short_*,_int)>).
  super_WithParamInterface<(anonymous_namespace)::SatdTestParam<int_(*)(const_short_*,_int)>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__SatdLpTest_00f45fa0;
  return;
}

Assistant:

SatdLpTest() : SatdTestBase(GetParam()) {}